

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::RealMath1Function<&cos>::RealMath1Function
          (RealMath1Function<&cos> *this,Builtins *builtins,KnownSystemName knownNameId)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_49;
  Type *local_48;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_40;
  
  __l._M_len = 1;
  __l._M_array = &local_48;
  local_48 = &(builtins->realType).super_Type;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_40,__l,&local_49);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,knownNameId,Function,1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_40,&(builtins->realType).super_Type,false,false);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_40);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_005b01a0;
  return;
}

Assistant:

RealMath1Function(const Builtins& builtins, KnownSystemName knownNameId) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 1, {&builtins.realType},
                               builtins.realType, false) {}